

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void fail(error_code eCode,char *what)

{
  size_t sVar1;
  ostream *poVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (what == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x58ddf8);
  }
  else {
    sVar1 = strlen(what);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,what,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  (*(eCode.cat_)->_vptr_error_category[4])(&local_40,eCode.cat_,eCode._0_8_ & 0xffffffff);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

static void fail(beast::error_code eCode, char const* what)
{
    std::cerr << what << ": " << eCode.message() << "\n";
}